

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void ge_equals_ge(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (a->infinity == b->infinity) {
    if (a->infinity != 0) {
      return;
    }
    iVar1 = secp256k1_fe_equal_var(&a->x,&b->x);
    if (iVar1 == 0) {
      pcVar3 = "test condition failed: secp256k1_fe_equal_var(&a->x, &b->x)";
      uVar2 = 0xe9f;
    }
    else {
      iVar1 = secp256k1_fe_equal_var(&a->y,&b->y);
      if (iVar1 != 0) {
        return;
      }
      pcVar3 = "test condition failed: secp256k1_fe_equal_var(&a->y, &b->y)";
      uVar2 = 0xea0;
    }
  }
  else {
    pcVar3 = "test condition failed: a->infinity == b->infinity";
    uVar2 = 0xe9b;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void ge_equals_ge(const secp256k1_ge *a, const secp256k1_ge *b) {
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    CHECK(secp256k1_fe_equal_var(&a->x, &b->x));
    CHECK(secp256k1_fe_equal_var(&a->y, &b->y));
}